

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void op_addImm(MCInst *MI,int v)

{
  cs_detail *pcVar1;
  uint8_t *puVar2;
  int v_local;
  MCInst *MI_local;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    *(long *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = (long)v;
    if (MI->csh->syntax == 2) {
      MI->has_imm = true;
    }
    else if ((MI->flat_insn->detail->field_6).x86.op_count == '\0') {
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = MI->imm_size;
    }
    else {
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] =
           *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68);
    }
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  if (MI->op1_size == '\0') {
    MI->op1_size = MI->imm_size;
  }
  return;
}

Assistant:

void op_addImm(MCInst *MI, int v)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = v;
		// if op_count > 0, then this operand's size is taken from the destination op
		if (MI->csh->syntax != CS_OPT_SYNTAX_ATT) {
			if (MI->flat_insn->detail->x86.op_count > 0)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->flat_insn->detail->x86.operands[0].size;
			else
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
		} else
			MI->has_imm = true;
		MI->flat_insn->detail->x86.op_count++;
	}

	if (MI->op1_size == 0)
		MI->op1_size = MI->imm_size;
}